

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::Rho(EAM *this,RealType r,RealType re,RealType fe,RealType beta,RealType lambda)

{
  RealType in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  RealType RVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  EAM *in_XMM4_Qa;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  if (*(int *)((long)in_RDI + 0xf8) == 3) {
    local_8 = exp(-in_XMM3_Qa * (in_XMM0_Qa / in_XMM1_Qa - 1.0));
    local_8 = in_XMM2_Qa * local_8;
  }
  else if ((*(int *)((long)in_RDI + 0xf8) == 2) || (*(int *)((long)in_RDI + 0xf8) == 0)) {
    dVar1 = exp(-in_XMM3_Qa * (in_XMM0_Qa / in_XMM1_Qa - 1.0));
    RVar2 = fastPower(in_XMM4_Qa,in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_8 = (in_XMM2_Qa * dVar1) / (RVar2 + 1.0);
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

RealType EAM::Rho(RealType r, RealType re, RealType fe, RealType beta,
                    RealType lambda) {
    if (mixMeth_ == eamDream2) {
      return (fe * exp(-beta * (r / re - 1.0)));
    }

    else if ((mixMeth_ == eamDream1) || (mixMeth_ == eamJohnson)) {
      return (fe * exp(-beta * (r / re - 1.0))) /
             (1.0 + fastPower(r / re - lambda, 20));
    }

    else
      return 0;
  }